

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateUTest.hpp
# Opt level: O0

void Qentem::Test::TestRawVariableUTag4(QTest *test)

{
  StringStream<char16_t> *pSVar1;
  undefined1 local_38 [8];
  Value<char16_t> value;
  StringStream<char16_t> ss;
  QTest *test_local;
  
  StringStream<char16_t>::StringStream((StringStream<char16_t> *)&value.type_);
  Value<char16_t>::Value((Value<char16_t> *)local_38);
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"<");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L">");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"&");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"\"");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"\'");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"<>");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"<&");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"<&");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L">\"");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"\"\'");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"<\">");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"<\'>");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"<&>");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"&\"&");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"\"\'\"");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"\'<\'");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"\'&\'");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"<>&\'\"");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"\'\"<>&");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"<\"&\'>");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"<<<<<");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L">>>>>");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"&&&&&");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"\"\"\"\"\"");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"\'\'\'\'\'");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"A<");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"A>");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"A&");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"A\"");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"A\'");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"<A");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L">A");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"&A");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"\"A");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"\'A");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"A<A");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"A>A");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"A&A");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"A\"A");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"A\'A");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"AA<AA");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"AA>AA");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"AA&AA");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"AA\"AA");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"AA\'AA");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"AA<<<<AA");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"AA>>>>AA");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"AA&&&&AA");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"AA\"\"\"\"AA");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"AA\'\'\'\'AA");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"<A>B\'C\"D&E\'F\"G<H>I&G\"K");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"AB\"CD\'EF<GH>IGK\'");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"\"ABC\'DEF<GHI>GK<");
  Value<char16_t>::operator+=((Value<char16_t> *)local_38,L"A\"\"BC<<DE>>FG\'\'HI&&GK");
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:0}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_)
  ;
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar1,(char16_t (*) [2])0x13095e,0x648);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:1}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_)
  ;
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar1,(char16_t (*) [2])0x1308fe,0x64b);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:2}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_)
  ;
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar1,(char16_t (*) [2])0x130916,0x64e);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:3}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_)
  ;
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar1,(char16_t (*) [2])0x130982,0x651);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:4}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_)
  ;
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar1,(char16_t (*) [2])0x131582,0x654);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:5}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_)
  ;
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])L"<>",0x657);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:6}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_)
  ;
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])L"<&",0x65a);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:7}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_)
  ;
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])L"<&",0x65d);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:8}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_)
  ;
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])L">\"",0x660);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:9}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_)
  ;
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])L"\"\'",0x663);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:10}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar1,(char16_t (*) [4])L"<\">",0x666);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:11}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar1,(char16_t (*) [4])L"<\'>",0x669);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:12}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar1,(char16_t (*) [4])L"<&>",0x66c);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:13}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar1,(char16_t (*) [4])L"&\"&",0x66f);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:14}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar1,(char16_t (*) [4])L"\"\'\"",0x672);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:15}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar1,(char16_t (*) [4])L"\'<\'",0x675);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:16}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar1,(char16_t (*) [4])L"\'&\'",0x678);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:17}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar1,(char16_t (*) [6])L"<>&\'\"",0x67b);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:18}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar1,(char16_t (*) [6])L"\'\"<>&",0x67e);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:19}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar1,(char16_t (*) [6])L"<\"&\'>",0x681);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:20}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar1,(char16_t (*) [6])L"<<<<<",0x684);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:21}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar1,(char16_t (*) [6])L">>>>>",0x687);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:22}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar1,(char16_t (*) [6])L"&&&&&",0x68a);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:23}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar1,(char16_t (*) [6])L"\"\"\"\"\"",0x68d);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:24}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar1,(char16_t (*) [6])L"\'\'\'\'\'",0x690);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:25}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])L"A<",0x693);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:26}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])L"A>",0x696);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:27}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])L"A&",0x699);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:28}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])L"A\"",0x69c);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:29}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])L"A\'",0x69f);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:30}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])0x1309b2,0x6a2);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:31}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])0x1309ba,0x6a5);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:32}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])0x1309c2,0x6a8);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:33}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])0x1309ca,0x6ab);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:34}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])0x1309d2,0x6ae);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:35}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar1,(char16_t (*) [4])L"A<A",0x6b1);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:36}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar1,(char16_t (*) [4])L"A>A",0x6b4);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:37}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar1,(char16_t (*) [4])L"A&A",0x6b7);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:38}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar1,(char16_t (*) [4])L"A\"A",0x6ba);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:39}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar1,(char16_t (*) [4])L"A\'A",0x6bd);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:40}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar1,(char16_t (*) [6])L"AA<AA",0x6c0);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:41}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar1,(char16_t (*) [6])L"AA>AA",0x6c3);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:42}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar1,(char16_t (*) [6])L"AA&AA",0x6c6);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:43}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar1,(char16_t (*) [6])L"AA\"AA",0x6c9);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:44}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar1,(char16_t (*) [6])L"AA\'AA",0x6cc);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:45}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (test,pSVar1,(char16_t (*) [9])L"AA<<<<AA",0x6cf);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:46}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (test,pSVar1,(char16_t (*) [9])L"AA>>>>AA",0x6d2);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:47}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (test,pSVar1,(char16_t (*) [9])L"AA&&&&AA",0x6d5);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:48}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (test,pSVar1,(char16_t (*) [9])L"AA\"\"\"\"AA",0x6d8);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:49}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (test,pSVar1,(char16_t (*) [9])L"AA\'\'\'\'AA",0x6db);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:50}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[23]>
            (test,pSVar1,(char16_t (*) [23])L"<A>B\'C\"D&E\'F\"G<H>I&G\"K",0x6de);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:51}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[17]>
            (test,pSVar1,(char16_t (*) [17])L"AB\"CD\'EF<GH>IGK\'",0x6e1);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:52}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[17]>
            (test,pSVar1,(char16_t (*) [17])L"\"ABC\'DEF<GHI>GK<",0x6e4);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:53}",(Value<char16_t> *)local_38,(StringStream<char16_t> *)&value.type_
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[22]>
            (test,pSVar1,(char16_t (*) [22])L"A\"\"BC<<DE>>FG\'\'HI&&GK",0x6e7);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value.type_);
  Value<char16_t>::~Value((Value<char16_t> *)local_38);
  StringStream<char16_t>::~StringStream((StringStream<char16_t> *)&value.type_);
  return;
}

Assistant:

static void TestRawVariableUTag4(QTest &test) {
    StringStream<char16_t> ss;
    Value<char16_t>        value;

    value += uR"(<)";
    value += uR"(>)";
    value += uR"(&)";
    value += uR"(")";
    value += uR"(')";
    value += uR"(<>)";
    value += uR"(<&)";
    value += uR"(<&)";
    value += uR"(>")";
    value += uR"("')";
    value += uR"(<">)";
    value += uR"(<'>)";
    value += uR"(<&>)";
    value += uR"(&"&)";
    value += uR"("'")";
    value += uR"('<')";
    value += uR"('&')";
    value += uR"(<>&'")";
    value += uR"('"<>&)";
    value += uR"(<"&'>)";

    value += uR"(<<<<<)";
    value += uR"(>>>>>)";
    value += uR"(&&&&&)";
    value += uR"(""""")";
    value += uR"(''''')";

    value += uR"(A<)";
    value += uR"(A>)";
    value += uR"(A&)";
    value += uR"(A")";
    value += uR"(A')";
    value += uR"(<A)";
    value += uR"(>A)";
    value += uR"(&A)";
    value += uR"("A)";
    value += uR"('A)";
    value += uR"(A<A)";
    value += uR"(A>A)";
    value += uR"(A&A)";
    value += uR"(A"A)";
    value += uR"(A'A)";

    value += uR"(AA<AA)";
    value += uR"(AA>AA)";
    value += uR"(AA&AA)";
    value += uR"(AA"AA)";
    value += uR"(AA'AA)";

    value += uR"(AA<<<<AA)";
    value += uR"(AA>>>>AA)";
    value += uR"(AA&&&&AA)";
    value += uR"(AA""""AA)";
    value += uR"(AA''''AA)";

    value += uR"(<A>B'C"D&E'F"G<H>I&G"K)";
    value += uR"(AB"CD'EF<GH>IGK')";
    value += uR"("ABC'DEF<GHI>GK<)";
    value += uR"(A""BC<<DE>>FG''HI&&GK)";

    test.IsEqual(Template::Render(uR"({raw:0})", value, ss), uR"(<)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:1})", value, ss), uR"(>)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:2})", value, ss), uR"(&)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:3})", value, ss), uR"(")", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:4})", value, ss), uR"(')", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:5})", value, ss), uR"(<>)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:6})", value, ss), uR"(<&)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:7})", value, ss), uR"(<&)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:8})", value, ss), uR"(>")", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:9})", value, ss), uR"("')", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:10})", value, ss), uR"(<">)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:11})", value, ss), uR"(<'>)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:12})", value, ss), uR"(<&>)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:13})", value, ss), uR"(&"&)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:14})", value, ss), uR"("'")", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:15})", value, ss), uR"('<')", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:16})", value, ss), uR"('&')", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:17})", value, ss), uR"(<>&'")", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:18})", value, ss), uR"('"<>&)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:19})", value, ss), uR"(<"&'>)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:20})", value, ss), uR"(<<<<<)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:21})", value, ss), uR"(>>>>>)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:22})", value, ss), uR"(&&&&&)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:23})", value, ss), uR"(""""")", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:24})", value, ss), uR"(''''')", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:25})", value, ss), uR"(A<)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:26})", value, ss), uR"(A>)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:27})", value, ss), uR"(A&)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:28})", value, ss), uR"(A")", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:29})", value, ss), uR"(A')", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:30})", value, ss), uR"(<A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:31})", value, ss), uR"(>A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:32})", value, ss), uR"(&A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:33})", value, ss), uR"("A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:34})", value, ss), uR"('A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:35})", value, ss), uR"(A<A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:36})", value, ss), uR"(A>A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:37})", value, ss), uR"(A&A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:38})", value, ss), uR"(A"A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:39})", value, ss), uR"(A'A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:40})", value, ss), uR"(AA<AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:41})", value, ss), uR"(AA>AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:42})", value, ss), uR"(AA&AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:43})", value, ss), uR"(AA"AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:44})", value, ss), uR"(AA'AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:45})", value, ss), uR"(AA<<<<AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:46})", value, ss), uR"(AA>>>>AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:47})", value, ss), uR"(AA&&&&AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:48})", value, ss), uR"(AA""""AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:49})", value, ss), uR"(AA''''AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:50})", value, ss), uR"(<A>B'C"D&E'F"G<H>I&G"K)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:51})", value, ss), uR"(AB"CD'EF<GH>IGK')", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:52})", value, ss), uR"("ABC'DEF<GHI>GK<)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:53})", value, ss), uR"(A""BC<<DE>>FG''HI&&GK)", __LINE__);
    ss.Clear();
}